

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

void Curl_mime_cleanpart(curl_mimepart *part)

{
  Curl_easy *pCVar1;
  
  if (part->freefunc != (curl_free_callback)0x0) {
    (*part->freefunc)(part->arg);
  }
  part->readfunc = (curl_read_callback)0x0;
  part->seekfunc = (curl_seek_callback)0x0;
  part->freefunc = (curl_free_callback)0x0;
  part->arg = part;
  part->data = (char *)0x0;
  part->fp = (FILE *)0x0;
  part->datasize = 0;
  (part->encstate).pos = 0;
  (part->encstate).bufbeg = 0;
  (part->encstate).bufend = 0;
  part->kind = MIMEKIND_NONE;
  curl_slist_free_all(part->curlheaders);
  if ((part->flags & 1) != 0) {
    curl_slist_free_all(part->userheaders);
  }
  (*Curl_cfree)(part->mimetype);
  part->mimetype = (char *)0x0;
  (*Curl_cfree)(part->name);
  part->name = (char *)0x0;
  (*Curl_cfree)(part->filename);
  part->filename = (char *)0x0;
  pCVar1 = part->easy;
  memset(part,0,0x1c0);
  part->easy = pCVar1;
  (part->state).state = MIMESTATE_BEGIN;
  (part->state).ptr = (void *)0x0;
  (part->state).offset = 0;
  return;
}

Assistant:

void Curl_mime_cleanpart(curl_mimepart *part)
{
  cleanup_part_content(part);
  curl_slist_free_all(part->curlheaders);
  if(part->flags & MIME_USERHEADERS_OWNER)
    curl_slist_free_all(part->userheaders);
  Curl_safefree(part->mimetype);
  Curl_safefree(part->name);
  Curl_safefree(part->filename);
  Curl_mime_initpart(part, part->easy);
}